

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevdevice.h
# Opt level: O1

bool __thiscall EvdevDevice::addDevice(EvdevDevice *this,Input *input)

{
  pointer *ppDVar1;
  iterator __position;
  Device DVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  char *pcVar6;
  ostream *poVar7;
  Device local_20;
  
  iVar3 = access((input->path)._M_dataplus._M_p,0);
  if (iVar3 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Cannot access \'",0x16);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(input->path)._M_dataplus._M_p,
                        (input->path)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'. Does it exist?",0x11);
    bVar5 = false;
  }
  else {
    iVar3 = open((input->path)._M_dataplus._M_p,0x800);
    bVar5 = iVar3 != 0;
    if (iVar3 == 0) {
      poVar7 = (ostream *)&std::cerr;
      pcVar6 = "ERROR: Cannot open \'";
      lVar4 = 0x14;
    }
    else {
      local_20.role = input->role;
      __position._M_current =
           (this->_devices).
           super__Vector_base<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_20.fd = iVar3;
      if (__position._M_current ==
          (this->_devices).
          super__Vector_base<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>::
        _M_realloc_insert<EvdevDevice::Device>(&this->_devices,__position,&local_20);
      }
      else {
        DVar2.role = local_20.role;
        DVar2.fd = iVar3;
        *__position._M_current = DVar2;
        ppDVar1 = &(this->_devices).
                   super__Vector_base<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      poVar7 = (ostream *)&std::cout;
      pcVar6 = "Successfully added device \'";
      lVar4 = 0x1b;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(input->path)._M_dataplus._M_p,(input->path)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'.",2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return bVar5;
}

Assistant:

bool EvdevDevice::addDevice(Input const& input)
{
  if(access(input.path.data(), F_OK ) != -1)
  {
    int fd = open(input.path.data(), O_RDONLY | O_NDELAY);
    if(!fd)
    {
      std::cerr << "ERROR: Cannot open '" << input.path << "'." << std::endl;
      return false;
    }

    _devices.push_back({fd, input.role});
    std::cout << "Successfully added device '" << input.path << "'." << std::endl;
  }

  else
  {
    std::cerr << "ERROR: Cannot access '" << input.path << "'. Does it exist?" << std::endl;
    return false;
  }

  return true;
}